

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O0

vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
* __thiscall assembler::VirtualChannel::process(VirtualChannel *this,VCDU *vcdu)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  size_t sVar6;
  pointer pTVar7;
  TransportPDU *__nbytes;
  int *in_RSI;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *in_RDI;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *in_stack_00000080;
  unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
  *in_stack_00000088;
  VirtualChannel *in_stack_00000090;
  size_t bytesAvailable;
  size_type bytesNeeded;
  size_t len;
  uint8_t *data;
  int skip;
  size_t pos;
  uint16_t firstHeader;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *out;
  pointer in_stack_fffffffffffffe28;
  TransportPDU *in_stack_fffffffffffffe30;
  TransportPDU *in_stack_fffffffffffffe40;
  TransportPDU *this_00;
  TransportPDU *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffea0;
  pointer local_130;
  undefined1 local_88 [40];
  pointer local_60;
  pointer local_58;
  pointer local_50;
  byte *local_48;
  int local_2c;
  pointer local_28;
  ushort local_1c;
  undefined1 local_19;
  
  local_19 = 0;
  std::
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ::vector((vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
            *)0x13a8ff);
  if (-1 < in_RSI[1]) {
    VCDU::getCounter((VCDU *)in_stack_fffffffffffffe40);
    local_2c = diffWithWrap<16777216u>
                         ((uint)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                          (uint)in_stack_fffffffffffffea0);
    if (1 < local_2c) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"VC ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*in_RSI);
      poVar5 = std::operator<<(poVar5,": VCDU drop! (lost ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2c + -1);
      poVar5 = std::operator<<(poVar5,"; prev: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RSI[1]);
      poVar5 = std::operator<<(poVar5,"; packet: ");
      iVar3 = VCDU::getCounter((VCDU *)in_stack_fffffffffffffe40);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      poVar5 = std::operator<<(poVar5,")");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::reset
                ((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                  *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
  }
  iVar3 = VCDU::getCounter((VCDU *)in_stack_fffffffffffffe40);
  in_RSI[1] = iVar3;
  local_48 = VCDU::data((VCDU *)0x13ab1a);
  sVar6 = VCDU::len((VCDU *)0x13ab41);
  __nbytes = (TransportPDU *)(ulong)local_48[1];
  local_1c = (*local_48 & 7) << 8 | (ushort)local_48[1];
  local_48 = local_48 + 2;
  local_50 = (pointer)(sVar6 - 2);
  local_28 = (pointer)0x0;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                      *)0x13abc7);
  if (!bVar1) goto LAB_0013b026;
  std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
  operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *)
             0x13abe1);
  bVar1 = TransportPDU::headerComplete((TransportPDU *)0x13abe9);
  if (bVar1) {
    std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
    operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *
               )0x13ac13);
    uVar2 = TransportPDU::length(in_stack_fffffffffffffe30);
    pTVar7 = std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             ::operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                           *)0x13ac49);
    __nbytes = (TransportPDU *)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pTVar7->data);
    local_58 = (pointer)((ulong)uVar2 - (long)__nbytes);
    if (local_1c == 0x7ff) {
      local_130 = local_50;
    }
    else {
      local_130 = (pointer)(ulong)local_1c;
    }
    local_60 = local_130;
    if ((local_1c == 0x7ff) || (local_58 <= local_130)) {
      pTVar7 = std::
               unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
               operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                           *)0x13ae26);
      __nbytes = (TransportPDU *)
                 TransportPDU::read(pTVar7,(int)local_48 + (int)local_28,local_50 + -(long)local_28,
                                    (size_t)__nbytes);
      local_28 = local_28 + (long)__nbytes;
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                  *)0x13ae7c);
      bVar1 = TransportPDU::dataComplete(in_stack_fffffffffffffe40);
      if (bVar1) {
        std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
        unique_ptr((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                    *)in_stack_fffffffffffffe30,
                   (unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                    *)in_stack_fffffffffffffe28);
        process(in_stack_00000090,in_stack_00000088,in_stack_00000080);
        std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
        ~unique_ptr((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                     *)in_stack_fffffffffffffe40);
      }
    }
    else {
      if ((local_130 == (pointer)0x0) && (local_58 == (pointer)0x6)) {
        std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
        operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                    *)0x13acfc);
        uVar4 = TransportPDU::apid(in_stack_fffffffffffffe30);
        if (uVar4 != 0x7ff) goto LAB_0013ad1f;
      }
      else {
LAB_0013ad1f:
        poVar5 = std::operator<<((ostream *)&std::cerr,"VC ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*in_RSI);
        poVar5 = std::operator<<(poVar5,": M_SDU continuation failed; ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)local_58);
        poVar5 = std::operator<<(poVar5," byte(s) needed to complete M_SDU, ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)local_60);
        poVar5 = std::operator<<(poVar5," byte(s) available");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::reset
                ((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                  *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
  }
  else {
    pTVar7 = std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             ::operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                           *)0x13af1b);
    __nbytes = (TransportPDU *)
               TransportPDU::read(pTVar7,(int)local_48 + (int)local_28,local_50 + -(long)local_28,
                                  (size_t)__nbytes);
    local_28 = local_28 + (long)__nbytes;
    std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
    operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *
               )0x13af71);
    bVar1 = TransportPDU::dataComplete(in_stack_fffffffffffffe40);
    if (bVar1) {
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      unique_ptr((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                  *)in_stack_fffffffffffffe30,
                 (unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                  *)in_stack_fffffffffffffe28);
      process(in_stack_00000090,in_stack_00000088,in_stack_00000080);
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      ~unique_ptr((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                   *)in_stack_fffffffffffffe40);
    }
  }
  if (local_28 == local_50) {
    return in_RDI;
  }
LAB_0013b026:
  if (local_1c != 0x7ff) {
    local_28 = (pointer)(ulong)local_1c;
    while (local_28 < local_50) {
      operator_new(0x30);
      TransportPDU::TransportPDU(in_stack_fffffffffffffe50);
      this_00 = (TransportPDU *)(local_88 + 8);
      std::unique_ptr<assembler::TransportPDU,std::default_delete<assembler::TransportPDU>>::
      unique_ptr<std::default_delete<assembler::TransportPDU>,void>
                ((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                  *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      operator=((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                 *)in_stack_fffffffffffffe30,
                (unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                 *)in_stack_fffffffffffffe28);
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      ~unique_ptr((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                   *)this_00);
      pTVar7 = std::
               unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
               operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                           *)0x13b0d6);
      __nbytes = (TransportPDU *)
                 TransportPDU::read(pTVar7,(int)local_48 + (int)local_28,local_50 + -(long)local_28,
                                    (size_t)__nbytes);
      local_28 = local_28 + (long)__nbytes;
      in_stack_fffffffffffffe50 = __nbytes;
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                  *)0x13b12c);
      bVar1 = TransportPDU::dataComplete(this_00);
      if (bVar1) {
        in_stack_fffffffffffffe30 = (TransportPDU *)local_88;
        std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
        unique_ptr((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                    *)in_stack_fffffffffffffe30,
                   (unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                    *)in_stack_fffffffffffffe28);
        process(in_stack_00000090,in_stack_00000088,in_stack_00000080);
        std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
        ~unique_ptr((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                     *)this_00);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<std::unique_ptr<SessionPDU>> VirtualChannel::process(const VCDU& vcdu) {
  std::vector<std::unique_ptr<SessionPDU>> out;
  uint16_t firstHeader;
  size_t pos;

  // Sanity check on VCDU counter (wraps at 2^24)
  if (n_ >= 0) {
    auto skip = diffWithWrap<(1 << 24)>(n_, vcdu.getCounter());

    // Abort processing of pending TP_PDU in case of drop.
    if (skip > 1) {
      std::cerr
        <<  "VC " << id_
        << ": VCDU drop! (lost " << (skip - 1)
        << "; prev: " << n_
        << "; packet: " << vcdu.getCounter()
        << ")"
        << std::endl;
      tpdu_.reset();
    }
  }

  // Update counter with current VCDU
  n_ = vcdu.getCounter();

  // Get iterators to begin/end of the VCDU Data Unit
  auto data = vcdu.data();
  auto len = vcdu.len();

  // Extract "first header pointer" field from M_PDU header
  firstHeader = ((data[0] & 0x7) << 8) | data[1];

  // Skip over M_PDU header
  data += 2;
  len -= 2;

  // Resume extracting a packet if we still have a pointer
  pos = 0;
  if (tpdu_) {
    // Double check that the number of bytes left to read correspond
    // with the first header pointer. The latter takes precedence.
    if (tpdu_->headerComplete()) {
      auto bytesNeeded = tpdu_->length() - tpdu_->data.size();
      // If the first header pointer is 2047, there is no additional
      // header in the VCDU and we can read the entire thing.
      auto bytesAvailable = (firstHeader == 2047) ? len : firstHeader;
      if (firstHeader != 2047 && bytesAvailable < bytesNeeded) {
        // Don't log error message for fill packets.
        // On the GOES-16 HRIT feed these can expect 6 more bytes
        // if they are aligned on the VCDU boundary. I suspect this
        // number comes from the the 6 header bytes in a VCDU and
        // that this is a mistake in the HRIT feed assembly code.
        if (!(bytesAvailable == 0 && bytesNeeded == 6 && tpdu_->apid() == 2047)) {
          std::cerr
            <<  "VC " << id_
            << ": M_SDU continuation failed; "
            << bytesNeeded << " byte(s) needed to complete M_SDU, "
            << bytesAvailable << " byte(s) available"
            << std::endl;
        }
        tpdu_.reset();
      } else {
        pos += tpdu_->read(&data[pos], len - pos);
        if (tpdu_->dataComplete()) {
          process(std::move(tpdu_), out);
        }
      }
    } else {
      pos += tpdu_->read(&data[pos], len - pos);
      if (tpdu_->dataComplete()) {
        process(std::move(tpdu_), out);
      }
    }

    // Return early if we consumed all bytes
    if (pos == len) {
      return out;
    }
  }

  // Must have pointer to first header to continue
  if (firstHeader == 2047) {
    return out;
  }

  // Extract TP_PDUs until there is no more data
  pos = firstHeader;
  while (pos < len) {
    tpdu_ = std::unique_ptr<TransportPDU>(new TransportPDU);
    pos += tpdu_->read(&data[pos], len - pos);
    if (tpdu_->dataComplete()) {
      process(std::move(tpdu_), out);
    }
  }

  return out;
}